

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

void PrintInfoOnTarget(Component *c)

{
  _Rb_tree_header *p_Var1;
  _Hash_node_base *p_Var2;
  ostream *poVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  pointer pbVar7;
  __node_base *p_Var8;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPubDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPrivDeps;
  char local_61;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (c == (Component *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Component does not exist (double-check spelling)\n",0x31);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Root: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(c->root).m_pathname._M_dataplus._M_p,
                      (c->root).m_pathname._M_string_length);
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_60,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name: ",6);
  pcVar6 = (c->name)._M_dataplus._M_p;
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x139280);
  }
  else {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
  }
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_60,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  pcVar6 = (c->type)._M_dataplus._M_p;
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x139280);
  }
  else {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
  }
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_60,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lines of Code: ",0xf);
  for (p_Var2 = (c->files)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_60,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Recreate: ",10);
  pcVar9 = "false";
  pcVar6 = "false";
  if ((ulong)c->recreate != 0) {
    pcVar6 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar6,(ulong)c->recreate ^ 5);
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_60,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Has CMakeAddon.txt: ",0x14);
  if ((ulong)c->hasAddonCmake != 0) {
    pcVar9 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,(ulong)c->hasAddonCmake ^ 5);
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_60,1);
  SortedNiceNames_abi_cxx11_(&local_60,&c->pubDeps);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Public dependencies (",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
  pbVar7 = (pointer)CONCAT71(local_60.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_60.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pbVar7 != local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_60.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  SortedNiceNames_abi_cxx11_(&local_48,&c->privDeps);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nPrivate dependencies (",0x17);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
  pbVar7 = (pointer)CONCAT71(local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pbVar7 != local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_61 = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBuild-afters:",0xe);
  p_Var5 = (c->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(c->buildAfters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      local_61 = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nFiles (",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):",2);
  p_Var8 = &(c->files)._M_h._M_before_begin;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    local_61 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)(p_Var8[1]._M_nxt)->_M_nxt,(long)p_Var8[1]._M_nxt[1]._M_nxt);
  }
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
  PrintLinksForTarget(c);
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void PrintInfoOnTarget(Component *c) {
    if (!c) {
        std::cout << "Component does not exist (double-check spelling)\n";
        return;
    }
    std::cout << "Root: " << c->root.string() << '\n';
    std::cout << "Name: " << c->name.c_str() << '\n';
    std::cout << "Type: " << c->type.c_str() << '\n';
    std::cout << "Lines of Code: " << c->loc() << '\n';
    std::cout << "Recreate: " << (c->recreate ? "true" : "false") << '\n';
    std::cout << "Has CMakeAddon.txt: " << (c->hasAddonCmake ? "true" : "false") << '\n';

    std::vector<std::string> sortedPubDeps(SortedNiceNames(c->pubDeps));
    std::cout << "Public dependencies (" << sortedPubDeps.size() << "): ";
    for (auto &d : sortedPubDeps) {
        std::cout << ' ' << d;
    }
    std::vector<std::string> sortedPrivDeps(SortedNiceNames(c->privDeps));
    std::cout << "\nPrivate dependencies (" << sortedPrivDeps.size() << "): ";
    for (auto &d : sortedPrivDeps) {
        std::cout << ' ' << d;
    }
    std::cout << "\nBuild-afters:";
    for (auto &d : c->buildAfters) {
        std::cout << ' ' << d;
    }
    std::cout << "\nFiles (" << c->files.size() << "):";
    for (auto &d : c->files) {
        std::cout << ' ' << d->path.string();
    }
    std::cout << '\n';
    PrintLinksForTarget(c);
    std::cout << '\n';
}